

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFontGlyph * __thiscall ImFont::FindGlyph(ImFont *this,ImWchar c)

{
  ushort uVar1;
  ImWchar i;
  ImWchar c_local;
  ImFont *this_local;
  
  if ((uint)c < (uint)(this->IndexLookup).Size) {
    uVar1 = (this->IndexLookup).Data[c];
    if (uVar1 == 0xffff) {
      this_local = (ImFont *)this->FallbackGlyph;
    }
    else {
      this_local = (ImFont *)((this->Glyphs).Data + uVar1);
    }
  }
  else {
    this_local = (ImFont *)this->FallbackGlyph;
  }
  return (ImFontGlyph *)this_local;
}

Assistant:

const ImFontGlyph* ImFont::FindGlyph(ImWchar c) const
{
    if (c >= (size_t)IndexLookup.Size)
        return FallbackGlyph;
    const ImWchar i = IndexLookup.Data[c];
    if (i == (ImWchar)-1)
        return FallbackGlyph;
    return &Glyphs.Data[i];
}